

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_gtar_large.c
# Opt level: O0

ssize_t myread(archive *a,void *client_data,void **buff)

{
  my_reader *reader;
  void **buff_local;
  void *client_data_local;
  archive *a_local;
  
  if (*client_data == 0) {
    if (*(int *)((long)client_data + 0xc) < 1) {
      a_local = (archive *)0x0;
    }
    else {
      *buff = *(void **)((long)client_data + 0x10);
      *(int *)((long)client_data + 0xc) = *(int *)((long)client_data + 0xc) + -1;
      a_local = (archive *)0x200;
    }
  }
  else {
    *buff = *client_data;
    *(undefined8 *)client_data = 0;
    a_local = (archive *)(long)*(int *)((long)client_data + 8);
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
myread(struct archive *a, void *client_data, const void **buff)
{
  struct my_reader *reader = client_data;
  (void)a; /* UNUSED */

  if (reader->prefix != NULL) {
	  *buff = reader->prefix;
	  reader->prefix = NULL;
	  return reader->prefix_length;
  } else if (reader->zero_blocks_remaining > 0) {
	  *buff = reader->zero_block;
	  reader->zero_blocks_remaining -= 1;
	  return 512;
  } else {
	  return 0;
  }
}